

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O2

MultiIndexSet *
TasGrid::makeSequenceSet
          (MultiIndexSet *__return_storage_ptr__,int cnum_dimensions,int depth,TypeDepth type,
          TypeOneDRule crule,vector<int,_std::allocator<int>_> *anisotropic_weights,
          vector<int,_std::allocator<int>_> *level_limits)

{
  _Any_data *rule_exactness;
  TypeOneDRule local_5c;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_5c = crule;
  if ((type < (type_qptensor|type_level)) && ((0x12a0U >> (type & 0x1f) & 1) != 0)) {
    rule_exactness = &local_30;
    local_30._8_8_ = 0;
    local_30._M_unused._M_object = &local_5c;
    local_18 = std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridSequence.cpp:64:48)>
               ::_M_invoke;
    local_20 = std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridSequence.cpp:64:48)>
               ::_M_manager;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,(long)cnum_dimensions,depth,type,
               (function<int_(int)> *)rule_exactness,anisotropic_weights,level_limits);
  }
  else {
    rule_exactness = &local_58;
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridSequence.cpp:67:48)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridSequence.cpp:67:48)>
               ::_M_manager;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,(long)cnum_dimensions,depth,type,
               (function<int_(int)> *)rule_exactness,anisotropic_weights,level_limits);
  }
  ::std::_Function_base::~_Function_base((_Function_base *)rule_exactness);
  return __return_storage_ptr__;
}

Assistant:

inline MultiIndexSet makeSequenceSet(int cnum_dimensions, int depth, TypeDepth type, TypeOneDRule crule,
                                     const std::vector<int> &anisotropic_weights, const std::vector<int> &level_limits){
    return (OneDimensionalMeta::isExactQuadrature(type)) ?
        MultiIndexManipulations::selectTensors((size_t) cnum_dimensions, depth, type,
                                               [&](int i) -> int{ return OneDimensionalMeta::getQExact(i, crule); },
                                               anisotropic_weights, level_limits) :
        MultiIndexManipulations::selectTensors((size_t) cnum_dimensions, depth, type,
                                               [&](int i) -> int{ return i; }, anisotropic_weights, level_limits);
}